

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

void __thiscall
fasttext::HierarchicalSoftmaxLoss::dfs
          (HierarchicalSoftmaxLoss *this,int32_t node,real score,Predictions *predictions,
          Vector *hidden)

{
  const_reference pvVar1;
  element_type *peVar2;
  Predictions *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_RDI;
  uint in_XMM0_Da;
  double dVar3;
  real f;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  float fVar4;
  uint uVar5;
  
  uVar5 = in_XMM0_Da;
  pvVar1 = std::
           vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
           ::operator[]((vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                         *)&in_RDI[4].
                            super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
  if ((pvVar1->left == -1) &&
     (pvVar1 = std::
               vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
               ::operator[]((vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                             *)&in_RDI[4].
                                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)in_ESI),
     pvVar1->right == -1)) {
    std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
    emplace_back<float&,int&>
              (in_RDI,(float *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    return;
  }
  peVar2 = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x18a2db);
  (*peVar2->_vptr_Matrix[2])
            (peVar2,in_RCX,
             (long)(in_ESI - *(int *)&in_RDI[5].
                                      super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage));
  dVar3 = std::exp((double)(ulong)(in_XMM0_Da ^ 0x80000000));
  fVar4 = 1.0 / (SUB84(dVar3,0) + 1.0);
  std::
  vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
  ::operator[]((vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                *)&in_RDI[4].
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
  std_log(0.0);
  dfs((HierarchicalSoftmaxLoss *)CONCAT44(in_ESI,uVar5),(int32_t)((ulong)in_RDX >> 0x20),
      (real)in_RDX,in_RCX,(Vector *)CONCAT44(fVar4,in_stack_ffffffffffffffd8));
  std::
  vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
  ::operator[]((vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                *)&in_RDI[4].
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
  std_log(0.0);
  dfs((HierarchicalSoftmaxLoss *)CONCAT44(in_ESI,uVar5),(int32_t)((ulong)in_RDX >> 0x20),
      (real)in_RDX,in_RCX,(Vector *)CONCAT44(fVar4,in_stack_ffffffffffffffd8));
  return;
}

Assistant:

void HierarchicalSoftmaxLoss::dfs(
    int32_t node,
    real score,
    Predictions& predictions,
    const Vector& hidden) const {

  if (tree_[node].left == -1 && tree_[node].right == -1) {
    predictions.emplace_back(score, node);
    return;
  }

  real f = wo_->dotRow(hidden, node - osz_);
  f = 1. / (1 + std::exp(-f));

  dfs(tree_[node].left, score + std_log(1.0 - f), predictions, hidden);
  dfs(tree_[node].right, score + std_log(f), predictions, hidden);
}